

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdIOCallback.cpp
# Opt level: O2

void __thiscall
libebml::StdIOCallback::setFilePointer(StdIOCallback *this,int64 Offset,seek_mode Mode)

{
  uint __line;
  int iVar1;
  uint64 uVar2;
  ostream *poVar3;
  CRTError *this_00;
  int *piVar4;
  char *__assertion;
  string local_1c0;
  ostringstream Msg;
  
  if ((FILE *)this->File == (FILE *)0x0) {
    __assertion = "File!=0";
    __line = 0x73;
  }
  else {
    if (Mode < (seek_end|seek_current)) {
      iVar1 = fseek((FILE *)this->File,Offset,Mode);
      if (iVar1 == 0) {
        if (Mode == seek_beginning) {
          this->mCurrentPosition = Offset;
        }
        else if (Mode == seek_end) {
          uVar2 = ftell((FILE *)this->File);
          this->mCurrentPosition = uVar2;
        }
        else {
          this->mCurrentPosition = this->mCurrentPosition + Offset;
        }
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&Msg);
      poVar3 = std::operator<<((ostream *)&Msg,"Failed to seek file ");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      poVar3 = std::operator<<(poVar3," to offset ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," in mode ");
      std::ostream::operator<<(poVar3,Mode);
      this_00 = (CRTError *)__cxa_allocate_exception(0x18);
      std::__cxx11::stringbuf::str();
      piVar4 = __errno_location();
      CRTError::CRTError(this_00,&local_1c0,*piVar4);
      __cxa_throw(this_00,&CRTError::typeinfo,std::runtime_error::~runtime_error);
    }
    __assertion = "Mode==SEEK_CUR||Mode==SEEK_END||Mode==SEEK_SET";
    __line = 0x7f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/StdIOCallback.cpp"
                ,__line,"virtual void libebml::StdIOCallback::setFilePointer(int64, seek_mode)");
}

Assistant:

void StdIOCallback::setFilePointer(int64 Offset,seek_mode Mode)
{
  assert(File!=0);

  // There is a numeric cast in the boost library, which would be quite nice for this checking
  /*
    SL : replaced because unknown class in cygwin
    assert(Offset <= numeric_limits<long>::max());
    assert(Offset >= numeric_limits<long>::min());
  */

  assert(Offset <= LONG_MAX);
  assert(Offset >= LONG_MIN);

  assert(Mode==SEEK_CUR||Mode==SEEK_END||Mode==SEEK_SET);

  if(fseek(File,Offset,Mode)!=0) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    ostringstream Msg;
    Msg<<"Failed to seek file "<<File<<" to offset "<<(unsigned long)Offset<<" in mode "<<Mode;
    throw CRTError(Msg.str());
#else // GCC2
    mCurrentPosition = ftell(File);
#endif
  } else {
    switch ( Mode ) {
      case SEEK_CUR:
        mCurrentPosition += Offset;
        break;
      case SEEK_END:
        mCurrentPosition = ftell(File);
        break;
      case SEEK_SET:
        mCurrentPosition = Offset;
        break;
    }
  }
}